

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_tcp_accept(NETSOCKET sock,NETSOCKET *new_sock,NETADDR *a)

{
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int s;
  socklen_t sockaddr_len;
  sockaddr_in6 addr_1;
  sockaddr_in addr;
  NETADDR *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int local_58;
  socklen_t local_54 [6];
  int iStack_3c;
  int local_38;
  sockaddr local_34;
  sockaddr local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = invalid_socket._0_8_;
  *(int *)(in_RDX + 1) = invalid_socket.ipv6sock;
  iStack_3c = (int)((ulong)in_RDI >> 0x20);
  local_38 = in_ESI;
  if (-1 < in_RDI) {
    local_54[0] = 0x10;
    local_58 = accept(iStack_3c,&local_18,local_54);
    if (local_58 != -1) {
      sockaddr_to_netaddr((sockaddr *)CONCAT44(local_58,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      *(undefined4 *)in_RDX = 1;
      *(int *)((long)in_RDX + 4) = local_58;
      goto LAB_001668e9;
    }
  }
  if (-1 < local_38) {
    local_54[0] = 0x1c;
    local_58 = accept(local_38,&local_34,local_54);
    if (local_58 != -1) {
      sockaddr_to_netaddr((sockaddr *)CONCAT44(local_58,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      *(undefined4 *)in_RDX = 2;
      *(int *)(in_RDX + 1) = local_58;
      goto LAB_001668e9;
    }
  }
  local_58 = -1;
LAB_001668e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

int net_tcp_accept(NETSOCKET sock, NETSOCKET *new_sock, NETADDR *a)
{
	int s;
	socklen_t sockaddr_len;

	*new_sock = invalid_socket;

	if(sock.ipv4sock >= 0)
	{
		struct sockaddr_in addr;
		sockaddr_len = sizeof(addr);

		s = accept(sock.ipv4sock, (struct sockaddr *)&addr, &sockaddr_len);

		if (s != -1)
		{
			sockaddr_to_netaddr((const struct sockaddr *)&addr, a);
			new_sock->type = NETTYPE_IPV4;
			new_sock->ipv4sock = s;
			return s;
		}
	}

	if(sock.ipv6sock >= 0)
	{
		struct sockaddr_in6 addr;
		sockaddr_len = sizeof(addr);

		s = accept(sock.ipv6sock, (struct sockaddr *)&addr, &sockaddr_len);

		if (s != -1)
		{
			sockaddr_to_netaddr((const struct sockaddr *)&addr, a);
			new_sock->type = NETTYPE_IPV6;
			new_sock->ipv6sock = s;
			return s;
		}
	}

	return -1;
}